

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_validation.c
# Opt level: O3

REF_STATUS ref_validation_cell_face(REF_GRID ref_grid)

{
  int *piVar1;
  REF_NODE pRVar2;
  REF_CELL pRVar3;
  REF_INT *pRVar4;
  REF_INT *pRVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  void *__ptr;
  long lVar10;
  REF_CELL *ppRVar11;
  undefined8 uVar12;
  long lVar13;
  REF_STATUS ref_private_macro_code_rss;
  ulong uVar14;
  int iVar15;
  char *pcVar16;
  long lVar17;
  REF_FACE pRVar18;
  REF_INT local_7c;
  REF_INT nodes [4];
  REF_FACE ref_face;
  int local_4c;
  REF_NODE local_48;
  REF_CELL *local_40;
  long local_38;
  
  pRVar2 = ref_grid->node;
  uVar7 = ref_face_create(&ref_face,ref_grid);
  pRVar18 = ref_face;
  if (uVar7 == 0) {
    if ((long)ref_face->n < 0) {
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c",
             0x122,"ref_validation_cell_face","malloc hits of REF_INT negative");
      uVar7 = 1;
    }
    else {
      __ptr = malloc((long)ref_face->n << 2);
      if (__ptr == (void *)0x0) {
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
               ,0x122,"ref_validation_cell_face","malloc hits of REF_INT NULL");
        uVar7 = 2;
      }
      else {
        local_7c = 0;
        if (0 < pRVar18->n) {
          lVar10 = 0;
          do {
            *(undefined4 *)((long)__ptr + lVar10 * 4) = 0;
            lVar10 = lVar10 + 1;
            local_7c = (REF_INT)lVar10;
          } while (lVar10 < pRVar18->n);
        }
        local_40 = ref_grid->cell;
        ppRVar11 = ref_grid->cell + 8;
        lVar10 = 8;
        local_48 = pRVar2;
        do {
          pRVar3 = *ppRVar11;
          iVar8 = pRVar3->max;
          local_38 = lVar10;
          if (0 < iVar8) {
            iVar15 = 0;
            do {
              if ((pRVar3->c2n[(long)pRVar3->size_per * (long)iVar15] != -1) &&
                 (0 < pRVar3->face_per)) {
                lVar17 = 0;
                lVar10 = 0;
                local_4c = iVar15;
                do {
                  pRVar4 = pRVar3->c2n;
                  pRVar5 = pRVar3->f2n;
                  lVar13 = 0;
                  do {
                    nodes[lVar13] =
                         pRVar4[(long)pRVar3->size_per * (long)iVar15 +
                                (long)*(int *)((long)pRVar5 + lVar13 * 4 + lVar17)];
                    lVar13 = lVar13 + 1;
                  } while (lVar13 != 4);
                  uVar7 = ref_face_with(ref_face,nodes,&local_7c);
                  if (uVar7 != 0) {
                    uVar14 = (ulong)uVar7;
                    pcVar16 = "find cell face";
                    uVar12 = 300;
                    goto LAB_001d7fde;
                  }
                  piVar1 = (int *)((long)__ptr + (long)local_7c * 4);
                  *piVar1 = *piVar1 + 1;
                  lVar10 = lVar10 + 1;
                  lVar17 = lVar17 + 0x10;
                } while (lVar10 < pRVar3->face_per);
                iVar8 = pRVar3->max;
                iVar15 = local_4c;
              }
              iVar15 = iVar15 + 1;
            } while (iVar15 < iVar8);
          }
          ppRVar11 = local_40 + local_38 + 1;
          lVar10 = local_38 + 1;
        } while (lVar10 != 0x10);
        pRVar3 = ref_grid->cell[3];
        iVar8 = pRVar3->max;
        if (0 < iVar8) {
          iVar15 = 0;
          do {
            pRVar4 = pRVar3->c2n;
            if (pRVar4[(long)pRVar3->size_per * (long)iVar15] != -1) {
              lVar10 = 0;
              do {
                nodes[lVar10] = pRVar4[(long)pRVar3->size_per * (long)iVar15 + lVar10];
                lVar10 = lVar10 + 1;
              } while (lVar10 != 3);
              nodes[3] = nodes[0];
              uVar7 = ref_face_with(ref_face,nodes,&local_7c);
              if (uVar7 != 0) {
                uVar14 = (ulong)uVar7;
                ref_node_location(ref_grid->node,nodes[0]);
                ref_node_location(ref_grid->node,nodes[1]);
                ref_node_location(ref_grid->node,nodes[2]);
                ref_node_location(ref_grid->node,nodes[3]);
                pcVar16 = "find tri";
                uVar12 = 0x13f;
                goto LAB_001d7fde;
              }
              piVar1 = (int *)((long)__ptr + (long)local_7c * 4);
              *piVar1 = *piVar1 + 1;
              iVar8 = pRVar3->max;
            }
            iVar15 = iVar15 + 1;
          } while (iVar15 < iVar8);
        }
        pRVar3 = ref_grid->cell[6];
        iVar8 = pRVar3->max;
        if (0 < iVar8) {
          iVar15 = 0;
          do {
            pRVar4 = pRVar3->c2n;
            if (pRVar4[(long)pRVar3->size_per * (long)iVar15] != -1) {
              lVar10 = 0;
              do {
                nodes[lVar10] = pRVar4[(long)pRVar3->size_per * (long)iVar15 + lVar10];
                lVar10 = lVar10 + 1;
              } while (lVar10 != 4);
              uVar7 = ref_face_with(ref_face,nodes,&local_7c);
              if (uVar7 != 0) {
                uVar14 = (ulong)uVar7;
                ref_node_location(ref_grid->node,nodes[0]);
                ref_node_location(ref_grid->node,nodes[1]);
                ref_node_location(ref_grid->node,nodes[2]);
                ref_node_location(ref_grid->node,nodes[3]);
                pcVar16 = "find qua";
                uVar12 = 0x14f;
                goto LAB_001d7fde;
              }
              piVar1 = (int *)((long)__ptr + (long)local_7c * 4);
              *piVar1 = *piVar1 + 1;
              iVar8 = pRVar3->max;
            }
            iVar15 = iVar15 + 1;
          } while (iVar15 < iVar8);
        }
        local_7c = 0;
        pRVar18 = ref_face;
        if (ref_face->n < 1) {
          uVar7 = 0;
        }
        else {
          bVar6 = 0;
          do {
            iVar8 = *(int *)((long)__ptr + (long)local_7c * 4);
            if (ref_grid->mpi->n < 2) {
LAB_001d82ca:
              if (iVar8 != 2) {
LAB_001d82d3:
                printf(" hits %d\n");
                pRVar4 = ref_face->f2n;
                lVar10 = 0;
                do {
                  nodes[lVar10] = pRVar4[(long)local_7c * 4 + lVar10];
                  lVar10 = lVar10 + 1;
                } while (lVar10 != 4);
                printf("face %d nodes %d %d %d %d global %ld %ld %ld %ld\n");
                uVar7 = ref_node_location(ref_grid->node,nodes[0]);
                if (uVar7 != 0) {
                  uVar14 = (ulong)uVar7;
                  pcVar16 = "n0";
                  uVar12 = 0x16d;
                  goto LAB_001d7fde;
                }
                uVar7 = ref_node_location(ref_grid->node,nodes[1]);
                if (uVar7 != 0) {
                  uVar14 = (ulong)uVar7;
                  pcVar16 = "n1";
                  uVar12 = 0x16e;
                  goto LAB_001d7fde;
                }
                uVar7 = ref_node_location(ref_grid->node,nodes[2]);
                if (uVar7 != 0) {
                  uVar14 = (ulong)uVar7;
                  pcVar16 = "n2";
                  uVar12 = 0x16f;
                  goto LAB_001d7fde;
                }
                uVar7 = ref_node_location(ref_grid->node,nodes[3]);
                if (uVar7 != 0) {
                  uVar14 = (ulong)uVar7;
                  pcVar16 = "n3";
                  uVar12 = 0x170;
                  goto LAB_001d7fde;
                }
                bVar6 = 1;
                pRVar18 = ref_face;
              }
            }
            else {
              pRVar4 = local_48->part;
              iVar15 = local_48->ref_mpi->id;
              pRVar5 = pRVar18->f2n;
              uVar7 = local_7c * 4;
              if (((iVar15 == pRVar4[pRVar5[(int)uVar7]]) ||
                  (iVar15 == pRVar4[pRVar5[(int)(uVar7 | 1)]])) ||
                 (iVar15 == pRVar4[pRVar5[(int)(uVar7 | 2)]])) goto LAB_001d82ca;
              if ((iVar15 != pRVar4[pRVar5[(int)(uVar7 | 3)]]) || (2 < iVar8)) {
                if ((iVar15 != pRVar4[pRVar5[(int)(uVar7 | 3)]]) && (iVar8 < 3)) goto LAB_001d8454;
                goto LAB_001d82d3;
              }
              if (iVar8 < 2) goto LAB_001d82d3;
            }
LAB_001d8454:
            local_7c = local_7c + 1;
          } while (local_7c < pRVar18->n);
          uVar7 = (uint)bVar6;
        }
        free(__ptr);
        uVar9 = ref_face_free(pRVar18);
        if (uVar9 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c"
                 ,0x176,"ref_validation_cell_face",(ulong)uVar9,"face free");
          uVar7 = uVar9;
        }
      }
    }
  }
  else {
    uVar14 = (ulong)uVar7;
    pcVar16 = "face";
    uVar12 = 0x120;
LAB_001d7fde:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_validation.c",
           uVar12,"ref_validation_cell_face",uVar14,pcVar16);
    uVar7 = (uint)uVar14;
  }
  return uVar7;
}

Assistant:

REF_FCN REF_STATUS ref_validation_cell_face(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_FACE ref_face;
  REF_CELL ref_cell;
  REF_INT *hits;
  REF_INT face;
  REF_INT group, cell, cell_face;
  REF_INT node;
  REF_INT nodes[4];
  REF_BOOL problem, report;
  REF_STATUS code;

  problem = REF_FALSE;

  RSS(ref_face_create(&ref_face, ref_grid), "face");

  ref_malloc(hits, ref_face_n(ref_face), REF_INT);

  for (face = 0; face < ref_face_n(ref_face); face++) hits[face] = 0;

  each_ref_grid_3d_ref_cell(ref_grid, group, ref_cell) {
    each_ref_cell_valid_cell(ref_cell, cell) {
      each_ref_cell_cell_face(ref_cell, cell_face) {
        for (node = 0; node < 4; node++) {
          nodes[node] = ref_cell_f2n(ref_cell, node, cell_face, cell);
        }
        RSS(ref_face_with(ref_face, nodes, &face), "find cell face");
        hits[face]++;
      }
    }
  }

  ref_cell = ref_grid_tri(ref_grid);
  each_ref_cell_valid_cell(ref_cell, cell) {
    for (node = 0; node < 3; node++) {
      nodes[node] = ref_cell_c2n(ref_cell, node, cell);
    }
    nodes[3] = nodes[0];
    code = ref_face_with(ref_face, nodes, &face);
    if (REF_SUCCESS != code) {
      ref_node_location(ref_grid_node(ref_grid), nodes[0]);
      ref_node_location(ref_grid_node(ref_grid), nodes[1]);
      ref_node_location(ref_grid_node(ref_grid), nodes[2]);
      ref_node_location(ref_grid_node(ref_grid), nodes[3]);
    }
    RSS(code, "find tri");
    hits[face]++;
  }

  ref_cell = ref_grid_qua(ref_grid);
  each_ref_cell_valid_cell(ref_cell, cell) {
    for (node = 0; node < 4; node++) {
      nodes[node] = ref_cell_c2n(ref_cell, node, cell);
    }
    code = ref_face_with(ref_face, nodes, &face);
    if (REF_SUCCESS != code) {
      ref_node_location(ref_grid_node(ref_grid), nodes[0]);
      ref_node_location(ref_grid_node(ref_grid), nodes[1]);
      ref_node_location(ref_grid_node(ref_grid), nodes[2]);
      ref_node_location(ref_grid_node(ref_grid), nodes[3]);
    }
    RSS(code, "find qua");
    hits[face]++;
  }

  for (face = 0; face < ref_face_n(ref_face); face++) {
    report = REF_FALSE;
    if (ref_mpi_para(ref_grid_mpi(ref_grid))) {
      report = report || (2 < hits[face]);
      if (ref_node_owned(ref_node, ref_face_f2n(ref_face, 0, face)) ||
          ref_node_owned(ref_node, ref_face_f2n(ref_face, 1, face)) ||
          ref_node_owned(ref_node, ref_face_f2n(ref_face, 2, face)) ||
          ref_node_owned(ref_node, ref_face_f2n(ref_face, 3, face))) {
        report = report || (2 > hits[face]);
      }
    } else {
      report = report || (2 != hits[face]);
    }
    if (report) {
      problem = REF_TRUE;
      printf(" hits %d\n", hits[face]);
      for (node = 0; node < 4; node++) {
        nodes[node] = ref_face_f2n(ref_face, node, face);
      }
      printf("face %d nodes %d %d %d %d global " REF_GLOB_FMT " " REF_GLOB_FMT
             " " REF_GLOB_FMT " " REF_GLOB_FMT "\n",
             face, nodes[0], nodes[1], nodes[2], nodes[3],
             ref_node_global(ref_grid_node(ref_grid), nodes[0]),
             ref_node_global(ref_grid_node(ref_grid), nodes[1]),
             ref_node_global(ref_grid_node(ref_grid), nodes[2]),
             ref_node_global(ref_grid_node(ref_grid), nodes[3]));
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[0]), "n0");
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[1]), "n1");
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[2]), "n2");
      RSS(ref_node_location(ref_grid_node(ref_grid), nodes[3]), "n3");
    }
  }

  free(hits);

  RSS(ref_face_free(ref_face), "face free");

  return (problem ? REF_FAILURE : REF_SUCCESS);
}